

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

int GetLengthMTMessage(uchar *buf)

{
  undefined2 local_1a;
  uShort_MT extlen;
  uchar *buf_local;
  
  if (buf[3] == 0xff) {
    local_1a = CONCAT11(buf[4],buf[5]);
    buf_local._4_4_ = local_1a + 7;
  }
  else {
    buf_local._4_4_ = buf[3] + 5;
  }
  return buf_local._4_4_;
}

Assistant:

inline int GetLengthMTMessage(unsigned char* buf)
{
	uShort_MT extlen;

	if (buf[3] == EXT_LEN_MT)
	{
		extlen.c[0] = buf[5];
		extlen.c[1] = buf[4];
		return extlen.v+MIN_EXTENDED_BUF_LEN_MT;
	}
	else
	{
		return buf[3]+MIN_STANDARD_BUF_LEN_MT;
	}
}